

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O3

char ** RDL_calculate_pairwise_family
                  (char **cycle_array,uint nof_rings,uint nof_bonds,_func_int_void_ptr *stop)

{
  ulong uVar1;
  size_t __size;
  char *start_bonds;
  char *ring2_bonds;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  char **ppcVar7;
  void *__dest;
  char **current_rings;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long local_40;
  
  if (0xfffe < nof_rings) {
    return (char **)0x0;
  }
  uVar3 = (ulong)nof_rings;
  pvVar6 = calloc(1,uVar3 * uVar3);
  if (pvVar6 == (void *)0x0) {
    return (char **)0x0;
  }
  __size = uVar3 * 8;
  ppcVar7 = (char **)malloc(__size);
  if (nof_rings == 0) {
    pvVar6 = malloc(__size);
  }
  else {
    uVar4 = 0;
    uVar9 = 0;
    do {
      ppcVar7[uVar9] = (char *)((ulong)uVar4 + (long)pvVar6);
      uVar9 = uVar9 + 1;
      uVar4 = uVar4 + nof_rings;
    } while (uVar3 != uVar9);
    pvVar6 = malloc(__size);
    if (nof_rings != 0) {
      uVar9 = (ulong)nof_bonds;
      uVar13 = 0;
      do {
        __dest = malloc(uVar9);
        *(void **)((long)pvVar6 + uVar13 * 8) = __dest;
        memcpy(__dest,cycle_array[uVar13],uVar9);
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
      current_rings = (char **)malloc(__size);
      if (nof_rings != 0) {
        local_40 = 1;
        uVar13 = 0;
        do {
          iVar5 = (*stop)((void *)0x0);
          if (iVar5 != 0) break;
          uVar1 = uVar13 + 1;
          lVar14 = local_40;
          if (uVar1 < uVar3) {
            do {
              iVar5 = (*stop)((void *)0x0);
              if (iVar5 != 0) break;
              if (nof_bonds != 0) {
                start_bonds = *(char **)((long)pvVar6 + uVar13 * 8);
                ring2_bonds = *(char **)((long)pvVar6 + lVar14 * 8);
                uVar10 = 0;
                uVar4 = 0;
                do {
                  uVar4 = (uVar4 + 1) - (uint)(start_bonds[uVar10] == '\0');
                  uVar10 = uVar10 + 1;
                } while (uVar9 != uVar10);
                uVar10 = 0;
                uVar8 = 0;
                do {
                  uVar8 = (uVar8 + 1) - (uint)(ring2_bonds[uVar10] == '\0');
                  uVar10 = uVar10 + 1;
                } while (uVar9 != uVar10);
                if (uVar4 == uVar8 && nof_bonds != 0) {
                  uVar10 = 0;
                  iVar5 = 0;
                  do {
                    if (start_bonds[uVar10] != '\0') {
                      iVar5 = (iVar5 + 1) - (uint)(ring2_bonds[uVar10] == '\0');
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar9 != uVar10);
                  if (iVar5 != 0) {
                    uVar10 = 0;
                    uVar11 = 0;
                    do {
                      pcVar2 = *(char **)((long)pvVar6 + uVar10 * 8);
                      uVar8 = 0;
                      if (nof_bonds != 0) {
                        uVar12 = 0;
                        uVar8 = 0;
                        do {
                          uVar8 = (uVar8 + 1) - (uint)(pcVar2[uVar12] == '\0');
                          uVar12 = uVar12 + 1;
                        } while (uVar9 != uVar12);
                      }
                      if (uVar8 < uVar4) {
                        current_rings[uVar11] = pcVar2;
                        uVar11 = (ulong)((int)uVar11 + 1);
                      }
                      uVar10 = uVar10 + 1;
                    } while (uVar10 != uVar3);
                    iVar5 = RDL_check_property3(start_bonds,nof_bonds,ring2_bonds,current_rings,
                                                (uint)uVar11,0,stop);
                    ppcVar7[uVar13][lVar14] = (char)iVar5;
                    ppcVar7[lVar14][uVar13] = (char)iVar5;
                  }
                }
              }
              lVar14 = lVar14 + 1;
            } while ((uint)lVar14 != nof_rings);
          }
          local_40 = local_40 + 1;
          uVar13 = uVar1;
        } while (uVar1 != uVar3);
        if (nof_rings != 0) {
          uVar9 = 0;
          do {
            free(*(void **)((long)pvVar6 + uVar9 * 8));
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
      }
      goto LAB_0010a741;
    }
  }
  current_rings = (char **)malloc(__size);
LAB_0010a741:
  free(pvVar6);
  free(current_rings);
  return ppcVar7;
}

Assistant:

char** RDL_calculate_pairwise_family(const char** cycle_array,
                                  unsigned nof_rings,
                                  unsigned nof_bonds,
                                  int (*stop) (const void*))
{
  char* family_relation_data;
  char **family_relation, **ring_sets;
  const char **rings;
  const char *ring1, *ring2, *ring;
  unsigned i, j, k, ring1_count, ring2_count, intersection_count,
    ringcounter, ridx, ring_count;

  size_t matrix_size = nof_rings;

  if (nof_rings >= sqrt(UINT_MAX) - 1) {
    return NULL;
  }

  matrix_size *= nof_rings;

  /* first establish pairwise URF-relations */
  family_relation_data = malloc(matrix_size * sizeof(*family_relation_data));

  /* too much memory requested */
  if (!family_relation_data) {
    return NULL;
  }

  memset(family_relation_data, 0, matrix_size * sizeof(*family_relation_data));
  family_relation = malloc(nof_rings * sizeof(*family_relation));

  for (i = 0; i < nof_rings; ++i) {
    family_relation[i] = family_relation_data + i * nof_rings;
  }

  ring_sets = malloc(nof_rings * sizeof(*ring_sets));

  for (i = 0; i < nof_rings; ++i) {
    ring_sets[i] = malloc(nof_bonds * sizeof(**ring_sets));
    memcpy(ring_sets[i], cycle_array[i], nof_bonds);
  }

  rings = malloc(nof_rings * sizeof(*rings));

  for (i = 0; i < nof_rings && !stop(NULL); ++i) {
    for (j = i+1; j < nof_rings && !stop(NULL); ++j) {
      ring1 = ring_sets[i];
      ring2 = ring_sets[j];
      /* check property 1: |C1| == |C2| */
      ring1_count = RDL_count_bonds(ring1, nof_bonds);
      ring2_count = RDL_count_bonds(ring2, nof_bonds);
      if (ring1_count != ring2_count) {
        continue;
      }
      /* check property 2: C1 ^ C2 != o */
      intersection_count = 0;
      for (k = 0; k < nof_bonds; ++k) {
        if (ring1[k] && ring2[k]) {
          ++intersection_count;
        }
      }
      if (intersection_count == 0) {
        continue;
      }

      /*
       * check property 3: exists any subset of strictly smaller rings,
       * so the symmetric difference of ring 1 and a subset of
       * those smaller rings equals ring 2
       */
      ringcounter = 0;
      for(ridx = 0; ridx < nof_rings; ++ridx) {
        ring = ring_sets[ridx];
        ring_count = RDL_count_bonds(ring, nof_bonds);
        if (ring_count < ring1_count) {
          rings[ringcounter] = ring;
          ++ringcounter;
        }
      }

      family_relation[i][j] = RDL_check_property3(
          ring1, nof_bonds, ring2, rings, ringcounter, 0, stop);
      family_relation[j][i] = family_relation[i][j];
    }
  }

  for (i = 0; i < nof_rings; ++i) {
    free(ring_sets[i]);
  }

  free(ring_sets);
  free((void*)rings);

  return family_relation;
}